

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteUnittest.cpp
# Opt level: O0

void __thiscall ReadWriteUnittest::SetUp(ReadWriteUnittest *this)

{
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  allocator local_1a9;
  string local_1a8;
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  ReadWriteUnittest *local_10;
  ReadWriteUnittest *this_local;
  
  this->iSize = 0xc;
  this->jSize = 0x12;
  this->kSize = 10;
  this->intSize = 4;
  this->doubleSize = 8;
  this->floatSize = 4;
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::resize(&this->fieldInt2,(long)(this->iSize * this->kSize))
  ;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldInt3,(long)(this->iSize * this->jSize * this->kSize));
  std::vector<double,_std::allocator<double>_>::resize(&this->fieldDouble1,(long)this->jSize);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->fieldDouble3,(long)(this->iSize * this->jSize * this->kSize));
  std::vector<float,_std::allocator<float>_>::resize(&this->fieldFloat1,(long)this->jSize);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->fieldFloat3,(long)(this->iSize * this->jSize * this->kSize));
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldcheckInt2,(long)(this->iSize * this->kSize));
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldcheckInt3,(long)(this->iSize * this->jSize * this->kSize));
  std::vector<double,_std::allocator<double>_>::resize(&this->fieldcheckDouble1,(long)this->jSize);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->fieldcheckDouble3,(long)(this->iSize * this->jSize * this->kSize));
  std::vector<float,_std::allocator<float>_>::resize(&this->fieldcheckFloat1,(long)this->jSize);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->fieldcheckFloat3,(long)(this->iSize * this->jSize * this->kSize));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"./",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"ReadWriteUnittest",&local_69);
  ser::Serializer::Init(&this->ser,&local_30,&local_68,SerializerOpenModeWrite);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"TestSavepoint",&local_91);
  ser::Savepoint::Init(&this->sp,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"int3",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"int",&local_e1);
  ser::Serializer::RegisterField
            (&this->ser,&local_b8,&local_e0,this->intSize,this->iSize,this->jSize,this->kSize,1,0,0,
             0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"int2",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"int",&local_131);
  ser::Serializer::RegisterField
            (&this->ser,&local_108,&local_130,this->intSize,this->iSize,1,this->kSize,1,0,0,0,0,0,0,
             0,0);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"double3",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"double",&local_181);
  ser::Serializer::RegisterField
            (&this->ser,&local_158,&local_180,this->doubleSize,this->iSize,this->jSize,this->kSize,1
             ,0,0,0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a8,"double1",&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"double",&local_1d1);
  ser::Serializer::RegisterField
            (&this->ser,&local_1a8,&local_1d0,this->doubleSize,1,this->jSize,1,1,0,0,0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"float3",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"float",&local_221);
  ser::Serializer::RegisterField
            (&this->ser,&local_1f8,&local_220,this->floatSize,this->iSize,this->jSize,this->kSize,1,
             0,0,0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"float1",&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"float",&local_271);
  ser::Serializer::RegisterField
            (&this->ser,&local_248,&local_270,this->floatSize,1,this->jSize,1,1,0,0,0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  FillFields(this);
  return;
}

Assistant:

void SetUp() {
        iSize = 12;
        jSize = 18;
        kSize = 10;

        intSize = sizeof(int);
        doubleSize = sizeof(double);
        floatSize = sizeof(float);

        // Allocate fields
        fieldInt2.resize(iSize*kSize);
        fieldInt3.resize(iSize*jSize*kSize);
        fieldDouble1.resize(jSize);
        fieldDouble3.resize(iSize*jSize*kSize);
        fieldFloat1.resize(jSize);
        fieldFloat3.resize(iSize*jSize*kSize);
        fieldcheckInt2.resize(iSize*kSize);
        fieldcheckInt3.resize(iSize*jSize*kSize);
        fieldcheckDouble1.resize(jSize);
        fieldcheckDouble3.resize(iSize*jSize*kSize);
        fieldcheckFloat1.resize(jSize);
        fieldcheckFloat3.resize(iSize*jSize*kSize);

        // Initialize serialization objects
        ser.Init("./", "ReadWriteUnittest", SerializerOpenModeWrite);
        sp.Init("TestSavepoint");

        // Register fields
        ser.RegisterField("int3", "int", intSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("int2", "int", intSize, iSize, 1, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("double3", "double", doubleSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("double1", "double", doubleSize, 1, jSize, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("float3", "float", floatSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("float1", "float", floatSize, 1, jSize, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0);

        FillFields();
    }